

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
               *this,GetterXsYs<int> *getter1,GetterXsYRef<int> *getter2,
              TransformerLinLog *transformer,ImU32 col)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  GetterXsYRef<int> *pGVar5;
  TransformerLinLog *pTVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  double dVar9;
  ImPlotContext *pIVar10;
  int iVar11;
  long lVar12;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar3 = getter1->Count;
  iVar11 = getter2->Count;
  if (iVar3 < getter2->Count) {
    iVar11 = iVar3;
  }
  this->Prims = iVar11 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar10 = GImPlot;
  (this->P12).y = 0.0;
  lVar12 = (long)((getter1->Offset % iVar3 + iVar3) % iVar3) * (long)getter1->Stride;
  iVar3 = *(int *)((long)getter1->Xs + lVar12);
  dVar9 = log10((double)*(int *)((long)getter1->Ys + lVar12) /
                GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar11 = transformer->YAxis;
  pIVar4 = pIVar10->CurrentPlot;
  dVar1 = pIVar4->YAxis[iVar11].Range.Min;
  IVar2 = pIVar10->PixelRange[iVar11].Min;
  IVar7.y = (float)(pIVar10->My[iVar11] *
                    (((double)(float)(dVar9 / pIVar10->LogDenY[iVar11]) *
                      (pIVar4->YAxis[iVar11].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y)
  ;
  IVar7.x = (float)(pIVar10->Mx * ((double)iVar3 - (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
  this->P11 = IVar7;
  pIVar10 = GImPlot;
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  iVar3 = pGVar5->Count;
  iVar3 = *(int *)((long)pGVar5->Xs +
                  (long)((pGVar5->Offset % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride);
  dVar9 = log10(pGVar5->YRef / GImPlot->CurrentPlot->YAxis[pTVar6->YAxis].Range.Min);
  iVar11 = pTVar6->YAxis;
  pIVar4 = pIVar10->CurrentPlot;
  dVar1 = pIVar4->YAxis[iVar11].Range.Min;
  IVar2 = pIVar10->PixelRange[iVar11].Min;
  IVar8.y = (float)(pIVar10->My[iVar11] *
                    (((double)(float)(dVar9 / pIVar10->LogDenY[iVar11]) *
                      (pIVar4->YAxis[iVar11].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y)
  ;
  IVar8.x = (float)(pIVar10->Mx * ((double)iVar3 - (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
  this->P12 = IVar8;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }